

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UnaryAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::nullopt_t_const&>
          (BumpAllocator *this,UnaryAssertionOperator *args,AssertionExpr *args_1,nullopt_t *args_2)

{
  UnaryAssertionOperator UVar1;
  UnaryAssertionExpr *pUVar2;
  
  pUVar2 = (UnaryAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UnaryAssertionExpr *)this->endPtr < pUVar2 + 1) {
    pUVar2 = (UnaryAssertionExpr *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pUVar2 + 1);
  }
  UVar1 = *args;
  (pUVar2->super_AssertionExpr).kind = Unary;
  (pUVar2->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pUVar2->op = UVar1;
  pUVar2->expr = args_1;
  *(undefined8 *)
   ((long)&(pUVar2->range).super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._M_value.max.
           super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
  return pUVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }